

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jurassic-jigsaw.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  variant_alternative_t<1UL,_variant<int,_basic_ifstream<char>_>_> *file_00;
  ulong uVar1;
  ostream *poVar2;
  variant_alternative_t<0UL,_variant<int,_basic_ifstream<char>_>_> *pvVar3;
  int iVar4;
  double dVar5;
  optional<unsigned_long> oVar6;
  vector<state_t,_std::allocator<state_t>_> res;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  tiles_t tiles;
  _Tuple_impl<0UL,_std::unordered_multimap<std::array<char,_10UL>,_tile_orientation_t,_generic_tile_t<10UL>::line_hash,_std::equal_to<std::array<char,_10UL>_>,_std::allocator<std::pair<const_std::array<char,_10UL>,_tile_orientation_t>_>_>,_std::unordered_multimap<std::pair<std::array<char,_10UL>,_std::array<char,_10UL>_>,_tile_orientation_t,_generic_tile_t<10UL>::corner_hash,_std::equal_to<std::pair<std::array<char,_10UL>,_std::array<char,_10UL>_>_>,_std::allocator<std::pair<const_std::pair<std::array<char,_10UL>,_std::array<char,_10UL>_>,_tile_orientation_t>_>_>_>
  local_378;
  state_t local_308;
  state_t state;
  variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> file;
  
  if (argc == 2) {
    get_input(&file,2,argv);
    if (file.super__Variant_base<int,_std::basic_ifstream<char,_std::char_traits<char>_>_>.
        super__Move_assign_alias<int,_std::basic_ifstream<char>_>.
        super__Copy_assign_alias<int,_std::basic_ifstream<char>_>.
        super__Move_ctor_alias<int,_std::basic_ifstream<char>_>.
        super__Copy_ctor_alias<int,_std::basic_ifstream<char>_>.
        super__Variant_storage_alias<int,_std::basic_ifstream<char>_>._M_index == '\0') {
      pvVar3 = std::get<0ul,int,std::ifstream>(&file);
      iVar4 = *pvVar3;
    }
    else {
      file_00 = std::get<1ul,int,std::ifstream>(&file);
      tokenize_abi_cxx11_<std::ifstream>(&tokens,file_00);
      read_tiles(&tiles,&tokens);
      make_catalogs((tuple<std::unordered_multimap<std::array<char,_10UL>,_tile_orientation_t,_generic_tile_t<10UL>::line_hash,_std::equal_to<std::array<char,_10UL>_>,_std::allocator<std::pair<const_std::array<char,_10UL>,_tile_orientation_t>_>_>,_std::unordered_multimap<std::pair<std::array<char,_10UL>,_std::array<char,_10UL>_>,_tile_orientation_t,_generic_tile_t<10UL>::corner_hash,_std::equal_to<std::pair<std::array<char,_10UL>,_std::array<char,_10UL>_>_>,_std::allocator<std::pair<const_std::pair<std::array<char,_10UL>,_std::array<char,_10UL>_>,_tile_orientation_t>_>_>_>
                     *)&local_378,&tiles);
      dVar5 = SQRT(((double)CONCAT44(0x45300000,(int)(tiles._M_h._M_element_count >> 0x20)) -
                   1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)tiles._M_h._M_element_count) -
                   4503599627370496.0));
      uVar1 = (ulong)dVar5;
      uVar1 = (long)(dVar5 - 9.223372036854776e+18) & (long)uVar1 >> 0x3f | uVar1;
      state_t::state_t(&state,uVar1,uVar1,&tiles);
      state_t::state_t(&local_308,&state);
      solve(&res,&tiles,
            &local_378.
             super__Head_base<0UL,_std::unordered_multimap<std::array<char,_10UL>,_tile_orientation_t,_generic_tile_t<10UL>::line_hash,_std::equal_to<std::array<char,_10UL>_>,_std::allocator<std::pair<const_std::array<char,_10UL>,_tile_orientation_t>_>_>,_false>
             ._M_head_impl,(corner_tile_catalog_t *)&local_378,&local_308);
      state_t::~state_t(&local_308);
      state_t::magic_number
                (res.super__Vector_base<state_t,_std::allocator<state_t>_>._M_impl.
                 super__Vector_impl_data._M_start);
      poVar2 = std::operator<<((ostream *)&std::cout,"Part 1: ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::operator<<(poVar2,"\n");
      do {
        if (res.super__Vector_base<state_t,_std::allocator<state_t>_>._M_impl.
            super__Vector_impl_data._M_start ==
            res.super__Vector_base<state_t,_std::allocator<state_t>_>._M_impl.
            super__Vector_impl_data._M_finish) goto LAB_001034a3;
        oVar6 = sea_roughness(&tiles,res.super__Vector_base<state_t,_std::allocator<state_t>_>.
                                     _M_impl.super__Vector_impl_data._M_start);
        res.super__Vector_base<state_t,_std::allocator<state_t>_>._M_impl.super__Vector_impl_data.
        _M_start = res.super__Vector_base<state_t,_std::allocator<state_t>_>._M_impl.
                   super__Vector_impl_data._M_start + 1;
      } while (((undefined1  [16])
                oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
               (undefined1  [16])0x0);
      poVar2 = std::operator<<((ostream *)&std::cout,"Part 2: ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::operator<<(poVar2,"\n");
LAB_001034a3:
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      poVar2 = std::operator<<(poVar2,"\n");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::operator<<(poVar2,"\n");
      std::vector<state_t,_std::allocator<state_t>_>::~vector(&res);
      state_t::~state_t(&state);
      std::
      _Tuple_impl<0UL,_std::unordered_multimap<std::array<char,_10UL>,_tile_orientation_t,_generic_tile_t<10UL>::line_hash,_std::equal_to<std::array<char,_10UL>_>,_std::allocator<std::pair<const_std::array<char,_10UL>,_tile_orientation_t>_>_>,_std::unordered_multimap<std::pair<std::array<char,_10UL>,_std::array<char,_10UL>_>,_tile_orientation_t,_generic_tile_t<10UL>::corner_hash,_std::equal_to<std::pair<std::array<char,_10UL>,_std::array<char,_10UL>_>_>,_std::allocator<std::pair<const_std::pair<std::array<char,_10UL>,_std::array<char,_10UL>_>,_tile_orientation_t>_>_>_>
      ::~_Tuple_impl(&local_378);
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_generic_tile_t<10UL>_>,_std::allocator<std::pair<const_unsigned_long,_generic_tile_t<10UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&tiles._M_h);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&tokens);
      iVar4 = 0;
    }
    std::__detail::__variant::
    _Variant_storage<false,_int,_std::basic_ifstream<char,_std::char_traits<char>_>_>::
    ~_Variant_storage((_Variant_storage<false,_int,_std::basic_ifstream<char,_std::char_traits<char>_>_>
                       *)&file);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Usage: ");
    poVar2 = std::operator<<(poVar2,*argv);
    poVar2 = std::operator<<(poVar2," {path-to-file}");
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

auto main(int argc, char* argv[]) -> int {
  if (argc != 2) {
    std::cout << "Usage: " << argv[0] << " {path-to-file}" << std::endl;
    return 1;
  }

  auto file = get_input(argc, argv);

  if (std::holds_alternative<int>(file))
    return std::get<int>(file);

  auto& input = std::get<std::ifstream>(file);

  auto tokens = tokenize(input);

  auto tiles = read_tiles(tokens);

  // make LUTs
  auto [edges, corners] = make_catalogs(tiles);

  // try a logical image size: square N x N
  size_t x = std::sqrt(tiles.size());
  auto state = state_t { x, x, tiles };
  auto res = solve(tiles, edges, corners, state);

  auto a1 = res.front().magic_number();
  std::cout << "Part 1: " << a1 << "\n";

  size_t a2;
  for (const auto& r : res) {
    auto rough = sea_roughness(tiles, r);
    if (rough) {
      a2 = *rough;
      std::cout << "Part 2: " <<  a2 << "\n";
      break;
    }
  }

  std::cout << a1 << "\n" << a2 << "\n";
}